

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O2

int64_t wallet::GetImportTimestamp(UniValue *data,int64_t now)

{
  bool bVar1;
  UniValue *pUVar2;
  string *__lhs;
  UniValue *__return_storage_ptr__;
  char **in_RCX;
  long in_FS_OFFSET;
  char *local_48;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"timestamp",(allocator<char> *)&local_48);
  bVar1 = UniValue::exists(data,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (!bVar1) {
    pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Missing required timestamp field for key",
               (allocator<char> *)&local_48);
    JSONRPCError(pUVar2,-3,&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
    }
    goto LAB_0093986e;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"timestamp",(allocator<char> *)&local_48);
  pUVar2 = UniValue::operator[](data,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (pUVar2->typ == VSTR) {
    __lhs = UniValue::get_str_abi_cxx11_(pUVar2);
    bVar1 = std::operator==(__lhs,"now");
    if (!bVar1) goto LAB_00939792;
  }
  else {
    if (pUVar2->typ != VNUM) {
LAB_00939792:
      __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
      local_48 = uvTypeName(pUVar2->typ);
      tinyformat::format<char_const*>
                (&local_40,
                 (tinyformat *)"Expected number or \"now\" timestamp value for key. got type %s",
                 (char *)&local_48,in_RCX);
      JSONRPCError(__return_storage_ptr__,-3,&local_40);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_0093986e;
    }
    now = UniValue::getInt<long>(pUVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return now;
  }
LAB_0093986e:
  __stack_chk_fail();
}

Assistant:

static int64_t GetImportTimestamp(const UniValue& data, int64_t now)
{
    if (data.exists("timestamp")) {
        const UniValue& timestamp = data["timestamp"];
        if (timestamp.isNum()) {
            return timestamp.getInt<int64_t>();
        } else if (timestamp.isStr() && timestamp.get_str() == "now") {
            return now;
        }
        throw JSONRPCError(RPC_TYPE_ERROR, strprintf("Expected number or \"now\" timestamp value for key. got type %s", uvTypeName(timestamp.type())));
    }
    throw JSONRPCError(RPC_TYPE_ERROR, "Missing required timestamp field for key");
}